

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O2

void __thiscall Person::Person(Person *this,Person *p)

{
  this->_vptr_Person = (_func_int **)&PTR_validate_00109d08;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  (this->id)._M_string_length = 0;
  (this->id).field_2._M_local_buf[0] = '\0';
  Address::Address(&this->address);
  std::__cxx11::string::_M_assign((string *)&this->name);
  std::__cxx11::string::_M_assign((string *)&this->id);
  Address::operator=(&this->address,&p->address);
  return;
}

Assistant:

Person::Person(const Person &p) {
    name = p.name;
    id = p.id;
    address = p.address;
}